

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

QStringList * QStringConverter::availableCodecs(void)

{
  long lVar1;
  qsizetype qVar2;
  anon_class_1_0_00000001 *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000018;
  qsizetype i;
  qsizetype codecCount;
  QStringList *result;
  anon_class_1_0_00000001 availableCodec;
  rvalue_ref in_stack_ffffffffffffff88;
  QList<QString> *in_stack_ffffffffffffff90;
  anon_class_1_0_00000001 *this;
  long local_58;
  QList<QString> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  qVar2 = availableCodecCount();
  *(undefined1 **)(this + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  *(QString **)(this + 8) = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x5458ee);
  QList<QString>::reserve(in_stack_ffffffffffffffd8,in_stack_00000018);
  for (local_58 = 0; local_58 < qVar2; local_58 = local_58 + 1) {
    availableCodecs::anon_class_1_0_00000001::operator()(this,(qsizetype)in_RDI);
    QList<QString>::push_back(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    QString::~QString((QString *)0x545945);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QStringList *)in_RDI;
}

Assistant:

QStringList QStringConverter::availableCodecs()
{
    auto availableCodec = [](qsizetype index) -> QString
    {
    #if !defined(QT_USE_ICU_CODECS)
        return QString::fromLatin1(encodingInterfaces[index].name);
    #else
        if (index == 0) // "Locale", not provided by icu
            return QString::fromLatin1(
                        encodingInterfaces[QStringConverter::Encoding::System].name);
        QT_COM_THREAD_INIT
        // this mirrors the setup we do to set a converters name
        UErrorCode status = U_ZERO_ERROR;
        auto icuName = ucnv_getAvailableName(int32_t(index - 1));
        const char *standardName = ucnv_getStandardName(icuName, "MIME", &status);
        if (U_FAILURE(status) || !standardName) {
            status = U_ZERO_ERROR;
            standardName = ucnv_getStandardName(icuName, "IANA", &status);
        }
        if (!standardName)
            standardName = icuName;
        return QString::fromLatin1(standardName);
    #endif
    };

    qsizetype codecCount = availableCodecCount();
    QStringList result;
    result.reserve(codecCount);
    for (qsizetype i = 0; i < codecCount; ++i)
        result.push_back(availableCodec(i));
    return result;
}